

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZGeoElBC_*>::Fill
          (TPZVec<TPZGeoElBC_*> *this,TPZGeoElBC **copy,int64_t from,int64_t numelem)

{
  ostream *poVar1;
  void *this_00;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int64_t i;
  int64_t last;
  int64_t nel;
  int64_t first;
  long local_60;
  long local_58;
  long local_50;
  long local_40;
  long local_30;
  
  if ((in_RCX < 0) && (in_RCX != -1)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"TPZVec::Fill");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"It\'s negative parameter numelem, then numelem = ");
    this_00 = (void *)std::ostream::operator<<(poVar1,*(long *)(in_RDI + 0x10));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  local_50 = in_RDX;
  if (in_RDX < 0) {
    local_50 = 0;
  }
  if (*(long *)(in_RDI + 0x10) < local_50) {
    local_58 = *(long *)(in_RDI + 0x10);
  }
  else {
    local_58 = local_50;
  }
  local_30 = in_RCX;
  if (in_RCX < 0) {
    local_30 = *(long *)(in_RDI + 0x10);
  }
  if (*(long *)(in_RDI + 0x10) < in_RDX + local_30) {
    local_60 = *(long *)(in_RDI + 0x10);
  }
  else {
    local_60 = in_RDX + local_30;
  }
  for (local_40 = local_58; local_40 < local_60; local_40 = local_40 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 8) + local_40 * 8) = *in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}